

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_trie_test.cpp
# Opt level: O3

void __thiscall
adt_trie_test_DefaultConstructor_Test::TestBody(adt_trie_test_DefaultConstructor_Test *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  size_t sVar5;
  size_t sVar6;
  void *__dest;
  void *__dest_00;
  undefined8 *puVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  char **ppcVar11;
  long lVar12;
  AssertHelper local_80;
  trie_key key;
  internal local_70 [8];
  undefined8 *local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  AssertHelper local_48;
  long local_40;
  char *local_38;
  
  key = (trie_key)((ulong)key & 0xffffffff00000000);
  uVar1 = log_policy_format_text();
  uVar2 = log_policy_schedule_sync();
  uVar3 = log_policy_storage_sequential();
  uVar4 = log_policy_stream_stdio(_stdout);
  local_80.data_._0_4_ = log_configure_impl("metacall",4,uVar1,uVar2,uVar3,uVar4);
  testing::internal::CmpHelperEQ<int,int>
            (local_70,"(int)0",
             "(int)log_configure_impl(\"metacall\", 4, log_policy_format_text(), log_policy_schedule_sync(), log_policy_storage_sequential(), log_policy_stream_stdio(stdout))"
             ,(int *)&key,(int *)&local_80);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&key);
    if (local_68 == (undefined8 *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (char *)*local_68;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_trie_test/source/adt_trie_test.cpp"
               ,0x4a,pcVar9);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&key);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (key != (trie_key)0x0) {
      (**(code **)(*key + 8))();
    }
  }
  puVar7 = local_68;
  if (local_68 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_68 != local_68 + 2) {
      operator_delete((undefined8 *)*local_68);
    }
    operator_delete(puVar7);
  }
  local_58 = trie_create(hash_callback_str,comparable_callback_str);
  local_60 = vector_create(8);
  local_50 = vector_create(8);
  lVar12 = 0;
  do {
    local_38 = *(char **)((long)TestBody::keys_str + lVar12);
    sVar5 = strlen(local_38);
    pcVar9 = *(char **)((long)TestBody::values_str + lVar12);
    local_40 = lVar12;
    sVar6 = strlen(pcVar9);
    __dest = malloc(sVar5 + 1);
    key = __dest;
    __dest_00 = malloc(sVar6 + 1);
    memcpy(__dest,local_38,sVar5 + 1);
    memcpy(__dest_00,pcVar9,sVar6 + 1);
    uVar1 = local_60;
    vector_push_back(local_60,&key);
    local_80.data_._0_4_ = 0;
    local_48.data_._0_4_ = trie_insert(local_58,uVar1,__dest_00);
    testing::internal::CmpHelperEQ<int,int>
              (local_70,"(int)0","(int)trie_insert(t, keys, value)",(int *)&local_80,
               (int *)&local_48);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_80);
      pcVar9 = "";
      if (local_68 != (undefined8 *)0x0) {
        pcVar9 = (char *)*local_68;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_trie_test/source/adt_trie_test.cpp"
                 ,0x71,pcVar9);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if ((long *)CONCAT44(local_80.data_._4_4_,(int)local_80.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_80.data_._4_4_,(int)local_80.data_) + 8))();
      }
    }
    lVar12 = local_40;
    puVar7 = local_68;
    if (local_68 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_68 != local_68 + 2) {
        operator_delete((undefined8 *)*local_68);
      }
      operator_delete(puVar7);
    }
    lVar12 = lVar12 + 8;
  } while (lVar12 != 0x20);
  uVar1 = vector_copy(local_60);
  ppcVar11 = TestBody::values_str + 3;
  lVar12 = 0;
  do {
    pcVar9 = (char *)trie_get(local_58,uVar1);
    log_write_impl_va("metacall",0x7c,"TestBody",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_trie_test/source/adt_trie_test.cpp"
                      ,0,"%zu -> %s",lVar12,pcVar9);
    key = (trie_key)((ulong)key & 0xffffffff00000000);
    local_80.data_._0_4_ = strcmp(*ppcVar11,pcVar9);
    testing::internal::CmpHelperEQ<int,int>
              (local_70,"(int)0","(int)strcmp(values_str[keys_size - iterator - 1], value_str)",
               (int *)&key,(int *)&local_80);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&key);
      pcVar9 = "";
      if (local_68 != (undefined8 *)0x0) {
        pcVar9 = (char *)*local_68;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_trie_test/source/adt_trie_test.cpp"
                 ,0x7e,pcVar9);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&key);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      if (key != (trie_key)0x0) {
        (**(code **)(*key + 8))();
      }
    }
    puVar7 = local_68;
    if (local_68 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_68 != local_68 + 2) {
        operator_delete((undefined8 *)*local_68);
      }
      operator_delete(puVar7);
    }
    vector_pop_back(uVar1);
    lVar12 = lVar12 + 1;
    ppcVar11 = ppcVar11 + -1;
  } while (lVar12 != 4);
  vector_destroy(uVar1);
  puVar7 = (undefined8 *)vector_back(local_60);
  uVar1 = local_50;
  key = (trie_key)((ulong)key & 0xffffffff00000000);
  local_80.data_._0_4_ = trie_prefixes(local_58,*puVar7,local_50);
  testing::internal::CmpHelperEQ<int,int>
            (local_70,"(int)0","(int)trie_prefixes(t, *last_prefix, prefixes)",(int *)&key,
             (int *)&local_80);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&key);
    if (local_68 == (undefined8 *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (char *)*local_68;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_trie_test/source/adt_trie_test.cpp"
               ,0x87,pcVar9);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&key);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (key != (trie_key)0x0) {
      (**(code **)(*key + 8))();
    }
  }
  puVar7 = local_68;
  if (local_68 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_68 != local_68 + 2) {
      operator_delete((undefined8 *)*local_68);
    }
    operator_delete(puVar7);
  }
  log_write_impl_va("metacall",0x89,"TestBody",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_trie_test/source/adt_trie_test.cpp"
                    ,0,"cannonical path: ");
  lVar12 = vector_size(uVar1);
  ppcVar11 = TestBody::keys_str;
  if (lVar12 != 0) {
    uVar10 = 0;
    do {
      puVar7 = (undefined8 *)vector_at(uVar1,uVar10);
      pcVar9 = (char *)*puVar7;
      log_write_impl_va("metacall",0x91,"TestBody",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_trie_test/source/adt_trie_test.cpp"
                        ,0,"%s/",pcVar9);
      key = (trie_key)((ulong)key & 0xffffffff00000000);
      local_80.data_._0_4_ = strcmp(*ppcVar11,pcVar9);
      testing::internal::CmpHelperEQ<int,int>
                (local_70,"(int)0","(int)strcmp(keys_str[iterator], key_str)",(int *)&key,
                 (int *)&local_80);
      if (local_70[0] == (internal)0x0) {
        testing::Message::Message((Message *)&key);
        pcVar9 = "";
        if (local_68 != (undefined8 *)0x0) {
          pcVar9 = (char *)*local_68;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_trie_test/source/adt_trie_test.cpp"
                   ,0x93,pcVar9);
        testing::internal::AssertHelper::operator=(&local_80,(Message *)&key);
        testing::internal::AssertHelper::~AssertHelper(&local_80);
        if (key != (trie_key)0x0) {
          (**(code **)(*key + 8))();
        }
      }
      puVar7 = local_68;
      if (local_68 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_68 != local_68 + 2) {
          operator_delete((undefined8 *)*local_68);
        }
        operator_delete(puVar7);
      }
      uVar1 = local_50;
      uVar10 = uVar10 + 1;
      uVar8 = vector_size(local_50);
      ppcVar11 = ppcVar11 + 1;
    } while (uVar10 < uVar8);
  }
  uVar2 = local_60;
  vector_pop_back(local_60);
  puVar7 = (undefined8 *)vector_back(uVar2);
  uVar3 = local_58;
  uVar4 = trie_suffixes(local_58,*puVar7);
  trie_iterate(uVar3,trie_iterator_cb_print,0);
  trie_iterate(uVar4,trie_iterator_cb_print,0);
  trie_iterate(uVar3,trie_iterator_cb_clear,0);
  vector_destroy(uVar1);
  vector_destroy(uVar2);
  trie_destroy(uVar4);
  trie_destroy(uVar3);
  return;
}

Assistant:

TEST_F(adt_trie_test, DefaultConstructor)
{
	EXPECT_EQ((int)0, (int)log_configure("metacall",
						  log_policy_format_text(),
						  log_policy_schedule_sync(),
						  log_policy_storage_sequential(),
						  log_policy_stream_stdio(stdout)));

	size_t iterator;

	static const char *keys_str[] = {
		"this", "is", "a", "path"
	};

	static const char *values_str[] = {
		"these", "are", "the", "values"
	};

	trie t = trie_create(&hash_callback_str, &comparable_callback_str);

	vector keys = vector_create(sizeof(trie_key));

	vector keys_copy = NULL;

	vector prefixes = vector_create(sizeof(trie_key));

	trie suffix_trie = NULL;

	trie_key *last_prefix;

	size_t keys_size = sizeof(keys_str) / sizeof(keys_str[0]);

	for (iterator = 0; iterator < keys_size; ++iterator)
	{
		size_t key_size = strlen(keys_str[iterator]) + 1;
		size_t value_size = strlen(values_str[iterator]) + 1;

		trie_key key = malloc(key_size);
		trie_value value = malloc(value_size);

		memcpy(key, keys_str[iterator], key_size);
		memcpy(value, values_str[iterator], value_size);

		vector_push_back(keys, &key);

		EXPECT_EQ((int)0, (int)trie_insert(t, keys, value));
	}

	keys_copy = vector_copy(keys);

	for (iterator = 0; iterator < keys_size; ++iterator)
	{
		trie_value value = trie_get(t, keys_copy);

		const char *value_str = reinterpret_cast<const char *>(value);

		log_write("metacall", LOG_LEVEL_DEBUG, "%" PRIuS " -> %s", iterator, value_str);

		EXPECT_EQ((int)0, (int)strcmp(values_str[keys_size - iterator - 1], value_str));

		vector_pop_back(keys_copy);
	}

	vector_destroy(keys_copy);

	last_prefix = reinterpret_cast<trie_key *>(vector_back(keys));

	EXPECT_EQ((int)0, (int)trie_prefixes(t, *last_prefix, prefixes));

	log_write("metacall", LOG_LEVEL_DEBUG, "cannonical path: ");

	for (iterator = 0; iterator < vector_size(prefixes); ++iterator)
	{
		trie_key *key = reinterpret_cast<trie_key *>(vector_at(prefixes, iterator));

		const char *key_str = reinterpret_cast<const char *>(*key);

		log_write("metacall", LOG_LEVEL_DEBUG, "%s/", key_str);

		EXPECT_EQ((int)0, (int)strcmp(keys_str[iterator], key_str));
	}

	vector_pop_back(keys);

	last_prefix = reinterpret_cast<trie_key *>(vector_back(keys));

	suffix_trie = trie_suffixes(t, *last_prefix);

	trie_iterate(t, &trie_iterator_cb_print, NULL);

	trie_iterate(suffix_trie, &trie_iterator_cb_print, NULL);

	trie_iterate(t, &trie_iterator_cb_clear, NULL);

	vector_destroy(prefixes);

	vector_destroy(keys);

	trie_destroy(suffix_trie);

	trie_destroy(t);
}